

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O2

int S2::GetNumPoints(S2ShapeIndex *index)

{
  int iVar1;
  long *plVar2;
  int i;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  
  uVar3 = 0;
  iVar4 = 0;
  while( true ) {
    iVar1 = (*index->_vptr_S2ShapeIndex[2])(index);
    if (iVar1 <= (int)uVar3) break;
    iVar1 = (*index->_vptr_S2ShapeIndex[3])(index,(ulong)uVar3);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar2 != (long *)0x0) {
      iVar1 = (**(code **)(*plVar2 + 0x20))(plVar2);
      if (iVar1 == 0) {
        iVar1 = (**(code **)(*plVar2 + 0x10))(plVar2);
        iVar4 = iVar4 + iVar1;
      }
    }
    uVar3 = uVar3 + 1;
  }
  return iVar4;
}

Assistant:

int GetNumPoints(const S2ShapeIndex& index) {
  int count = 0;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == 0) {
      count += shape->num_edges();
    }
  }
  return count;
}